

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O2

void __thiscall
TCLAP::SpecificationException::SpecificationException
          (SpecificationException *this,string *text,string *id)

{
  allocator local_bb;
  allocator local_ba;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_78,"Exception found when an Arg object ",&local_b9);
  std::__cxx11::string::string((string *)&local_98,"is improperly defined by the ",&local_ba);
  std::operator+(&local_58,&local_78,&local_98);
  std::__cxx11::string::string((string *)&local_b8,"developer.",&local_bb);
  std::operator+(&local_38,&local_58,&local_b8);
  ArgException::ArgException(&this->super_ArgException,text,id,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  *(undefined ***)&this->super_ArgException = &PTR__ArgException_0014d9a0;
  return;
}

Assistant:

SpecificationException( const std::string& text = "undefined exception",
					            const std::string& id = "undefined" )
			: ArgException( text, 
			                id,
							std::string("Exception found when an Arg object ")+
							std::string("is improperly defined by the ") +
							std::string("developer." )) 
		{ }